

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_unit.cpp
# Opt level: O0

void test_cpp_remove_range(void **param_1)

{
  Roaring r2_7;
  Roaring r1_8;
  Roaring r2_6;
  Roaring r1_7;
  Roaring r2_5;
  Roaring r1_6;
  Roaring r2_4;
  Roaring r1_5;
  Roaring r2_3;
  Roaring r1_4;
  Roaring r2_2;
  Roaring r1_3;
  Roaring r2_1;
  Roaring r1_2;
  Roaring r2;
  Roaring r1_1;
  Roaring r1;
  uint32_t in_stack_fffffffffffffc48;
  uint32_t in_stack_fffffffffffffc4c;
  Roaring *in_stack_fffffffffffffc50;
  Roaring *this;
  char *in_stack_fffffffffffffc58;
  char *expression;
  undefined4 in_stack_fffffffffffffc60;
  uint uVar1;
  undefined4 in_stack_fffffffffffffc64;
  uint uVar2;
  undefined1 local_2c0 [24];
  Roaring local_298;
  undefined1 local_270 [80];
  undefined1 local_220 [80];
  undefined1 local_1d0 [80];
  undefined1 local_180 [40];
  undefined1 local_158 [40];
  undefined1 local_130 [40];
  undefined1 local_108 [40];
  undefined1 local_e0 [40];
  undefined1 local_b8 [40];
  undefined1 local_90 [40];
  undefined1 local_68 [56];
  undefined1 local_30 [48];
  
  roaring::Roaring::bitmapOf((size_t)local_30,3,1,2,4);
  roaring::Roaring::removeRangeClosed
            (in_stack_fffffffffffffc50,in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48);
  roaring::Roaring::isEmpty(in_stack_fffffffffffffc50);
  _assert_true(CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60),
               in_stack_fffffffffffffc58,(char *)in_stack_fffffffffffffc50,in_stack_fffffffffffffc4c
              );
  roaring::Roaring::~Roaring(in_stack_fffffffffffffc50);
  roaring::Roaring::bitmapOf((size_t)local_68,3,1,2);
  roaring::Roaring::removeRangeClosed
            (in_stack_fffffffffffffc50,in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48);
  roaring::Roaring::bitmapOf((size_t)local_90,1,4);
  roaring::Roaring::operator==
            (in_stack_fffffffffffffc50,
             (Roaring *)CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48));
  _assert_true(CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60),
               in_stack_fffffffffffffc58,(char *)in_stack_fffffffffffffc50,in_stack_fffffffffffffc4c
              );
  roaring::Roaring::~Roaring(in_stack_fffffffffffffc50);
  roaring::Roaring::~Roaring(in_stack_fffffffffffffc50);
  roaring::Roaring::bitmapOf((size_t)local_b8,3,1);
  roaring::Roaring::removeRangeClosed
            (in_stack_fffffffffffffc50,in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48);
  roaring::Roaring::bitmapOf((size_t)local_e0,1,4);
  roaring::Roaring::operator==
            (in_stack_fffffffffffffc50,
             (Roaring *)CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48));
  _assert_true(CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60),
               in_stack_fffffffffffffc58,(char *)in_stack_fffffffffffffc50,in_stack_fffffffffffffc4c
              );
  roaring::Roaring::~Roaring(in_stack_fffffffffffffc50);
  roaring::Roaring::~Roaring(in_stack_fffffffffffffc50);
  roaring::Roaring::bitmapOf((size_t)local_108,3,1,2,4);
  roaring::Roaring::removeRangeClosed
            (in_stack_fffffffffffffc50,in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48);
  roaring::Roaring::bitmapOf((size_t)local_130,2,1,2);
  roaring::Roaring::operator==
            (in_stack_fffffffffffffc50,
             (Roaring *)CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48));
  _assert_true(CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60),
               in_stack_fffffffffffffc58,(char *)in_stack_fffffffffffffc50,in_stack_fffffffffffffc4c
              );
  roaring::Roaring::~Roaring(in_stack_fffffffffffffc50);
  roaring::Roaring::~Roaring(in_stack_fffffffffffffc50);
  roaring::Roaring::bitmapOf((size_t)local_158,3,1,2,4);
  roaring::Roaring::removeRangeClosed
            (in_stack_fffffffffffffc50,in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48);
  roaring::Roaring::bitmapOf((size_t)local_180,1,1);
  roaring::Roaring::operator==
            (in_stack_fffffffffffffc50,
             (Roaring *)CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48));
  _assert_true(CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60),
               in_stack_fffffffffffffc58,(char *)in_stack_fffffffffffffc50,in_stack_fffffffffffffc4c
              );
  roaring::Roaring::~Roaring(in_stack_fffffffffffffc50);
  roaring::Roaring::~Roaring(in_stack_fffffffffffffc50);
  roaring::Roaring::bitmapOf();
  roaring::Roaring::removeRangeClosed
            (in_stack_fffffffffffffc50,in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48);
  roaring::Roaring::bitmapOf((size_t)local_1d0,3,1,2,4);
  roaring::Roaring::operator==
            (in_stack_fffffffffffffc50,
             (Roaring *)CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48));
  _assert_true(CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60),
               in_stack_fffffffffffffc58,(char *)in_stack_fffffffffffffc50,in_stack_fffffffffffffc4c
              );
  roaring::Roaring::~Roaring(in_stack_fffffffffffffc50);
  roaring::Roaring::~Roaring(in_stack_fffffffffffffc50);
  roaring::Roaring::bitmapOf();
  roaring::Roaring::removeRangeClosed
            (in_stack_fffffffffffffc50,in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48);
  roaring::Roaring::bitmapOf((size_t)local_220,3,1,2,4);
  roaring::Roaring::operator==
            (in_stack_fffffffffffffc50,
             (Roaring *)CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48));
  _assert_true(CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60),
               in_stack_fffffffffffffc58,(char *)in_stack_fffffffffffffc50,in_stack_fffffffffffffc4c
              );
  roaring::Roaring::~Roaring(in_stack_fffffffffffffc50);
  roaring::Roaring::~Roaring(in_stack_fffffffffffffc50);
  roaring::Roaring::bitmapOf();
  roaring::Roaring::removeRangeClosed
            (in_stack_fffffffffffffc50,in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48);
  roaring::Roaring::bitmapOf((size_t)local_270,3,1,2,4);
  roaring::Roaring::operator==
            (in_stack_fffffffffffffc50,
             (Roaring *)CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48));
  _assert_true(CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60),
               in_stack_fffffffffffffc58,(char *)in_stack_fffffffffffffc50,in_stack_fffffffffffffc4c
              );
  roaring::Roaring::~Roaring(in_stack_fffffffffffffc50);
  roaring::Roaring::~Roaring(in_stack_fffffffffffffc50);
  this = &local_298;
  expression = (char *)0x3;
  uVar1 = 1;
  uVar2 = 2;
  roaring::Roaring::bitmapOf();
  roaring::Roaring::removeRangeClosed(this,in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48);
  roaring::Roaring::bitmapOf((size_t)local_2c0,expression,(ulong)uVar1,(ulong)uVar2,4);
  roaring::Roaring::operator==
            (this,(Roaring *)CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48));
  _assert_true(CONCAT44(uVar2,uVar1),expression,(char *)this,in_stack_fffffffffffffc4c);
  roaring::Roaring::~Roaring(this);
  roaring::Roaring::~Roaring(this);
  return;
}

Assistant:

DEFINE_TEST(test_cpp_remove_range) {
    {
        // min < r1.minimum, max > r1.maximum
        Roaring r1 = Roaring::bitmapOf(3, 1, 2, 4);
        r1.removeRangeClosed(0, 5);
        assert_true(r1.isEmpty());
    }
    {
        // min < r1.minimum, max < r1.maximum, max does not exactly match an
        // element
        Roaring r1 = Roaring::bitmapOf(3, 1, 2, 4);
        r1.removeRangeClosed(0, 3);
        Roaring r2 = Roaring::bitmapOf(1, 4);
        assert_true(r1 == r2);
    }
    {
        // min < r1.minimum, max < r1.maximum, max exactly matches an element
        Roaring r1 = Roaring::bitmapOf(3, 1, 2, 4);
        r1.removeRangeClosed(0, 2);
        Roaring r2 = Roaring::bitmapOf(1, 4);
        assert_true(r1 == r2);
    }
    {
        // min > r1.minimum, max > r1.maximum, min does not exactly match an
        // element
        Roaring r1 = Roaring::bitmapOf(3, 1, 2, 4);
        r1.removeRangeClosed(3, 5);
        Roaring r2 = Roaring::bitmapOf(2, 1, 2);
        assert_true(r1 == r2);
    }
    {
        // min > r1.minimum, max > r1.maximum, min exactly matches an element
        Roaring r1 = Roaring::bitmapOf(3, 1, 2, 4);
        r1.removeRangeClosed(2, 5);
        Roaring r2 = Roaring::bitmapOf(1, 1);
        assert_true(r1 == r2);
    }
    {
        // min > r1.minimum, max < r1.maximum, no elements between min and max
        Roaring r1 = Roaring::bitmapOf(3, 1, 2, 4);
        r1.removeRangeClosed(3, 3);
        Roaring r2 = Roaring::bitmapOf(3, 1, 2, 4);
        assert_true(r1 == r2);
    }
    {
        // max < r1.minimum
        Roaring r1 = Roaring::bitmapOf(3, 1, 2, 4);
        r1.removeRangeClosed(0, 0);
        Roaring r2 = Roaring::bitmapOf(3, 1, 2, 4);
        assert_true(r1 == r2);
    }
    {
        // min > r1.maximum
        Roaring r1 = Roaring::bitmapOf(3, 1, 2, 4);
        r1.removeRangeClosed(5, 6);
        Roaring r2 = Roaring::bitmapOf(3, 1, 2, 4);
        assert_true(r1 == r2);
    }
    {
        // min > max
        Roaring r1 = Roaring::bitmapOf(3, 1, 2, 4);
        r1.removeRangeClosed(2, 1);
        Roaring r2 = Roaring::bitmapOf(3, 1, 2, 4);
        assert_true(r1 == r2);
    }
}